

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkState.cpp
# Opt level: O1

void __thiscall iDynTree::LinkInertias::LinkInertias(LinkInertias *this,size_t nrOfLinks)

{
  (this->m_linkInertials).
  super__Vector_base<iDynTree::SpatialInertia,_std::allocator<iDynTree::SpatialInertia>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_linkInertials).
  super__Vector_base<iDynTree::SpatialInertia,_std::allocator<iDynTree::SpatialInertia>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_linkInertials).
  super__Vector_base<iDynTree::SpatialInertia,_std::allocator<iDynTree::SpatialInertia>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  resize(this,nrOfLinks);
  return;
}

Assistant:

LinkInertias::LinkInertias(std::size_t nrOfLinks)
{
    this->resize(nrOfLinks);
}